

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::UdpEntrySyntax*>::
emplaceRealloc<slang::syntax::UdpEntrySyntax*>
          (SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *this,pointer pos,UdpEntrySyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppUVar4;
  long lVar5;
  pointer ppUVar6;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  UdpEntrySyntax **in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)0x2b9f3b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::calculateGrowth
                    (in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  ppUVar4 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::begin(in_RDI);
  lVar5 = (long)__last - (long)ppUVar4;
  ppUVar6 = (pointer)operator_new(0x2b9f9a);
  ppUVar6[lVar5 >> 3] = (UdpEntrySyntax *)*in_RDX;
  ppUVar4 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::end(in_RDI);
  if (in_RSI == ppUVar4) {
    ppUVar4 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::end(in_RDI);
    std::uninitialized_move<slang::syntax::UdpEntrySyntax**,slang::syntax::UdpEntrySyntax**>
              (in_RSI,__last,ppUVar4);
  }
  else {
    SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::begin(in_RDI);
    std::uninitialized_move<slang::syntax::UdpEntrySyntax**,slang::syntax::UdpEntrySyntax**>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::end(in_RDI);
    std::uninitialized_move<slang::syntax::UdpEntrySyntax**,slang::syntax::UdpEntrySyntax**>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = ppUVar6;
  return ppUVar6 + (lVar5 >> 3);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}